

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

Map * __thiscall AlternativeLoader::altReadMapFile(AlternativeLoader *this)

{
  int *piVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pvVar6;
  string *psVar7;
  istream *piVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  ulong uVar10;
  char *pcVar11;
  Map *map;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  undefined8 local_318;
  char local_309;
  char *local_308;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  undefined8 local_2d8;
  char local_2c9;
  char *local_2c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  undefined8 local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pLineWords;
  bool *pValidMap;
  int *pCountryCount;
  int *pContinentCount;
  int *pCountryID;
  int *pLineCount;
  string *pMode;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pTerritoryData;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pContinentData;
  string *pMapName;
  string line;
  long local_228;
  ifstream infile;
  bool verbose;
  AlternativeLoader *this_local;
  
  std::ifstream::ifstream(&local_228,(string *)this->pDominationMapFile,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if (((bVar2 & 1) == 0) && (iVar4 = std::istream::peek(), iVar4 != -1)) {
    std::__cxx11::string::string((string *)&pMapName);
    psVar5 = (string *)operator_new(0x20);
    std::__cxx11::string::string(psVar5);
    pContinentData =
         (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *)psVar5;
    pvVar6 = (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)operator_new(0x18);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::vector(pvVar6);
    pTerritoryData = pvVar6;
    psVar7 = (string *)operator_new(0x18);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)psVar7);
    pMode = psVar7;
    psVar5 = (string *)operator_new(0x20);
    std::__cxx11::string::string(psVar5);
    pLineCount = (int *)psVar5;
    pCountryID = (int *)operator_new(4);
    *pCountryID = 0;
    pContinentCount = (int *)operator_new(4);
    *pContinentCount = 1;
    pCountryCount = (int *)operator_new(4);
    *pCountryCount = 0;
    pValidMap = (bool *)operator_new(4);
    pValidMap[0] = false;
    pValidMap[1] = false;
    pValidMap[2] = false;
    pValidMap[3] = false;
    pLineWords = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)operator_new(1);
    *(undefined1 *)
     &(pLineWords->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = 1;
    while( true ) {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_228,(string *)&pMapName);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
      if (!bVar3) break;
      *pCountryID = *pCountryID + 1;
      pvVar9 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)operator_new(0x18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(pvVar9);
      local_2a8 = pvVar9;
      uVar10 = std::__cxx11::string::empty();
      if ((((uVar10 & 1) == 0) &&
          (pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)&pMapName), *pcVar11 != ';'))
         && ((pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)&pMapName), *pcVar11 != '\n'
             && (pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)&pMapName),
                *pcVar11 != '\r')))) {
        local_2c0._M_current = (char *)std::__cxx11::string::begin();
        local_2c8 = (char *)std::__cxx11::string::end();
        local_2c9 = '\n';
        local_2b8 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                              (local_2c0,
                               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )local_2c8,&local_2c9);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_2b0,&local_2b8);
        local_2e0._M_current = (char *)std::__cxx11::string::end();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_2d8,&local_2e0);
        local_2e8 = std::__cxx11::string::erase(&pMapName,local_2b0,local_2d8);
        local_300._M_current = (char *)std::__cxx11::string::begin();
        local_308 = (char *)std::__cxx11::string::end();
        local_309 = '\r';
        local_2f8 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                              (local_300,
                               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )local_308,&local_309);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_2f0,&local_2f8);
        local_320._M_current = (char *)std::__cxx11::string::end();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_318,&local_320);
        std::__cxx11::string::erase(&pMapName,local_2f0,local_318);
        bVar3 = altCheckSection(this,(string *)pLineCount,(string *)&pMapName);
        if (!bVar3) {
          altSplitLine(this,(string *)&pMapName,local_2a8,(string *)pLineCount);
          altGetMapName(this,(string *)pContinentData,local_2a8);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pLineCount,"Map");
          if (!bVar3) {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)pLineCount,"Continents");
            if (bVar3) {
              bVar3 = altValidateContinentLine
                                (this,pCountryCount,local_2a8,pCountryID,(bool *)pLineWords,false);
              if (!bVar3) {
                std::ifstream::close();
                this_local = (AlternativeLoader *)0x0;
                goto LAB_001333eb;
              }
              std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::push_back(pTerritoryData,local_2a8);
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)pLineCount,"Territories");
              if (bVar3) {
                bVar3 = altValidateTerritoriesLine
                                  (this,local_2a8,pCountryID,(bool *)pLineWords,false);
                if (!bVar3) {
                  std::ifstream::close();
                  this_local = (AlternativeLoader *)0x0;
                  goto LAB_001333eb;
                }
                std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::push_back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)pMode,local_2a8);
              }
            }
          }
          pvVar9 = local_2a8;
          if (local_2a8 !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(local_2a8);
            operator_delete(pvVar9,0x18);
          }
        }
      }
    }
    this_local = (AlternativeLoader *)
                 altInitMapObject((string *)pContinentData,pTerritoryData,
                                  (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)pMode,(bool *)pLineWords);
    piVar1 = pLineCount;
    if (pLineCount != (int *)0x0) {
      std::__cxx11::string::~string((string *)pLineCount);
      operator_delete(piVar1,0x20);
    }
    if (pCountryID != (int *)0x0) {
      operator_delete(pCountryID,4);
    }
    if (pCountryCount != (int *)0x0) {
      operator_delete(pCountryCount,4);
    }
    if (pValidMap != (bool *)0x0) {
      operator_delete(pValidMap,4);
    }
    if (pContinentCount != (int *)0x0) {
      operator_delete(pContinentCount,4);
    }
    std::ifstream::close();
    if (((((ulong)(pLineWords->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start & 1) == 0) ||
        (bVar3 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::empty(pTerritoryData), bVar3)) ||
       (bVar3 = std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::empty((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)pMode), bVar3)) {
      if (pLineWords !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        operator_delete(pLineWords,1);
      }
      pvVar6 = pTerritoryData;
      if (pTerritoryData !=
          (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)0x0) {
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(pTerritoryData);
        operator_delete(pvVar6,0x18);
      }
      psVar7 = pMode;
      if (pMode != (string *)0x0) {
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)pMode);
        operator_delete(psVar7,0x18);
      }
      this_local = (AlternativeLoader *)0x0;
    }
    else {
      if (pLineWords !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        operator_delete(pLineWords,1);
      }
      pvVar6 = pTerritoryData;
      if (pTerritoryData !=
          (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)0x0) {
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(pTerritoryData);
        operator_delete(pvVar6,0x18);
      }
      psVar7 = pMode;
      if (pMode != (string *)0x0) {
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)pMode);
        operator_delete(psVar7,0x18);
      }
    }
LAB_001333eb:
    line.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)&pMapName);
  }
  else {
    this_local = (AlternativeLoader *)0x0;
    line.field_2._8_4_ = 1;
  }
  std::ifstream::~ifstream(&local_228);
  return (Map *)this_local;
}

Assistant:

Map *AlternativeLoader::altReadMapFile() {
    //for debug purposes, change to true to print errors and warnings
    bool verbose = false;
    //create file stream to read file line by line
    std::ifstream infile(*pDominationMapFile);

    if(!infile || infile.peek() == EOF){
        return nullptr;
    }
    std::string line;

    //declare map info
    auto* pMapName = new std::string;
    auto* pContinentData = new std::vector<std::vector<std::string>>;
    auto* pTerritoryData = new std::vector<std::vector<std::string>>;
    auto* pMode = new std::string;

    //maintain counters for validation / error tracing
    auto* pLineCount = new int(0);
    auto* pCountryID = new int(1);
    auto* pContinentCount = new int(0);
    auto* pCountryCount = new int(0);
    auto* pValidMap = new bool(true);

    while (std::getline(infile, line)) {
        (*pLineCount)++;
        //will hold the words of each line (separated by spaces) in an array
        auto* pLineWords = new std::vector<std::string>;
        //ignore comments or empty lines
        if (line.empty() || line[0] == *";" || line[0] == *"\n" || line[0] == *"\r") {
            //do nothing, the line is empty or is a comment
            continue;
        } else {
            // strip every line of the \n and \r characters
            line.erase(std::remove(line.begin(), line.end(), '\n'), line.end());
            line.erase(std::remove(line.begin(), line.end(), '\r'), line.end());
            //check if we enter a new section
            if (altCheckSection(pMode, line)) {
                continue;
            }
            altSplitLine(line, pLineWords, *pMode);
            altGetMapName(pMapName, pLineWords);

            //read sections
            if (*pMode == "Map") {
                //this mode is in every example file, do we need it?
                if(verbose){
                    std::cout << "Line " << *pLineCount
                              << " - [WARNING] : the parser encountered the Map mode, which is not supported at the moment.\n";
                }
            } else if (*pMode == "Continents") {
                if (altValidateContinentLine(pContinentCount, pLineWords, pLineCount, pValidMap,verbose)) {
                    pContinentData->push_back(*pLineWords);
                } else {
                    infile.close();
                    return nullptr;
                }
            } else if (*pMode == "Territories") {
                if (altValidateTerritoriesLine(pLineWords, pLineCount, pValidMap,verbose)) {
                    pTerritoryData->push_back(*pLineWords);
                } else {
                    infile.close();
                    return nullptr;
                }
            } else {
                //unknown mode error, will be ignored, non-critical
                if(verbose){
                    std::cout << "\nLine " << *pLineCount << " - [WARNING] : the parser encountered an unknown mode. ";
                    std::cout << " ::  " << line;
                }
            }
        }
        delete (pLineWords);
    }
    //create map object
    auto* map = altInitMapObject(pMapName, pContinentData, pTerritoryData, pValidMap);

    //clean up
    delete (pMode);
    delete (pLineCount);
    delete (pContinentCount);
    delete (pCountryCount);
    delete (pCountryID);

    infile.close();
    if(!*pValidMap || pContinentData->empty() || pTerritoryData->empty()){
        delete (pValidMap);
        delete (pContinentData);
        delete (pTerritoryData);
        return nullptr;
    }
    delete (pValidMap);
    delete (pContinentData);
    delete (pTerritoryData);
    return map;
}